

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeMoved
          (QAbstractItemModelTesterPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destinationRow)

{
  QObject *pQVar1;
  bool bVar2;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_b8;
  ChangeInFlight local_a0 [6];
  char *local_88;
  QDebug local_80;
  undefined1 local_78 [24];
  QDebug local_60;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0[0] = None;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,local_a0,"changeInFlight","ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x36e);
  if (bVar2) {
    this->changeInFlight = RowsMoved;
    lcModelTest();
    if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
      local_a0[0] = ColumnsMoved;
      local_a0[1] = None;
      local_a0[2] = None;
      local_a0[3] = None;
      local_a0[4] = None;
      local_a0[5] = 0;
      local_88 = lcModelTest::category.name;
      QMessageLogger::debug();
      pQVar3 = QDebug::operator<<(&local_80,"rowsAboutToBeMoved");
      pQVar3 = QDebug::operator<<(pQVar3,"sourceStart=");
      pQVar3 = QDebug::operator<<(pQVar3,sourceStart);
      pQVar3 = QDebug::operator<<(pQVar3,"sourceEnd=");
      pQVar3 = QDebug::operator<<(pQVar3,sourceEnd);
      pQVar3 = QDebug::operator<<(pQVar3,"sourceParent=");
      local_78._0_8_ = pQVar3->stream;
      *(int *)(local_78._0_8_ + 0x28) = *(int *)(local_78._0_8_ + 0x28) + 1;
      operator<<((Stream *)(local_78 + 8),(QModelIndex *)local_78);
      pQVar3 = QDebug::operator<<((QDebug *)(local_78 + 8),"sourceParent data=");
      pQVar1 = (this->model).wp.value;
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,sourceParent,0);
      QVariant::toString();
      pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_b8);
      pQVar3 = QDebug::operator<<(pQVar3,"destinationParent=");
      local_78._16_8_ = pQVar3->stream;
      *(int *)(local_78._16_8_ + 0x28) = *(int *)(local_78._16_8_ + 0x28) + 1;
      operator<<((Stream *)&local_60,(QModelIndex *)(local_78 + 0x10));
      pQVar3 = QDebug::operator<<(&local_60,"destinationRow=");
      QDebug::operator<<(pQVar3,destinationRow);
      QDebug::~QDebug(&local_60);
      QDebug::~QDebug((QDebug *)(local_78 + 0x10));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QVariant::~QVariant(&local_58);
      QDebug::~QDebug((QDebug *)(local_78 + 8));
      QDebug::~QDebug((QDebug *)local_78);
      QDebug::~QDebug(&local_80);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeMoved(const QModelIndex &sourceParent,
                                                         int sourceStart, int sourceEnd,
                                                         const QModelIndex &destinationParent,
                                                         int destinationRow)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsMoved;

    qCDebug(lcModelTest) << "rowsAboutToBeMoved"
                         << "sourceStart=" << sourceStart << "sourceEnd=" << sourceEnd
                         << "sourceParent=" << sourceParent
                         << "sourceParent data=" << model->data(sourceParent).toString()
                         << "destinationParent=" << destinationParent
                         << "destinationRow=" << destinationRow;
}